

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O0

size_t duckdb_zstd::HUF_initRemainingDStream
                 (BIT_DStream_t *bit,HUF_DecompressFastArgs *args,int stream,BYTE *segmentEnd)

{
  uint uVar1;
  size_t sVar2;
  void *in_RCX;
  int in_EDX;
  long in_RSI;
  size_t *in_RDI;
  size_t local_8;
  
  if (in_RCX < *(void **)(in_RSI + 0x20 + (long)in_EDX * 8)) {
    local_8 = 0xffffffffffffffec;
  }
  else if (*(ulong *)(in_RSI + (long)in_EDX * 8) < *(long *)(in_RSI + 0x78 + (long)in_EDX * 8) - 8U)
  {
    local_8 = 0xffffffffffffffec;
  }
  else {
    sVar2 = MEM_readLEST(in_RCX);
    *in_RDI = sVar2;
    uVar1 = ZSTD_countTrailingZeros64(*(U64 *)(in_RSI + 0x40 + (long)in_EDX * 8));
    *(uint *)(in_RDI + 1) = uVar1;
    in_RDI[3] = *(size_t *)(in_RSI + 0x68);
    in_RDI[4] = in_RDI[3] + 8;
    in_RDI[2] = *(size_t *)(in_RSI + (long)in_EDX * 8);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t HUF_initRemainingDStream(BIT_DStream_t* bit, HUF_DecompressFastArgs const* args, int stream, BYTE* segmentEnd)
{
    /* Validate that we haven't overwritten. */
    if (args->op[stream] > segmentEnd)
        return ERROR(corruption_detected);
    /* Validate that we haven't read beyond iend[].
        * Note that ip[] may be < iend[] because the MSB is
        * the next bit to read, and we may have consumed 100%
        * of the stream, so down to iend[i] - 8 is valid.
        */
    if (args->ip[stream] < args->iend[stream] - 8)
        return ERROR(corruption_detected);

    /* Construct the BIT_DStream_t. */
    assert(sizeof(size_t) == 8);
    bit->bitContainer = MEM_readLEST(args->ip[stream]);
    bit->bitsConsumed = ZSTD_countTrailingZeros64(args->bits[stream]);
    bit->start = (const char*)args->ilowest;
    bit->limitPtr = bit->start + sizeof(size_t);
    bit->ptr = (const char*)args->ip[stream];

    return 0;
}